

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plugin_extension.cpp
# Opt level: O0

int __thiscall
mwheel::test::PluginExtension::clone
          (PluginExtension *this,__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  shared_ptr<mwheel::test::PluginExtension> *in_stack_ffffffffffffffc8;
  PluginExtension *this_00;
  
  this_00 = this;
  std::make_shared<mwheel::test::PluginExtension>();
  std::shared_ptr<mwheel::test::ClientInterface>::shared_ptr<mwheel::test::PluginExtension,void>
            ((shared_ptr<mwheel::test::ClientInterface> *)this_00,in_stack_ffffffffffffffc8);
  std::shared_ptr<mwheel::test::PluginExtension>::~shared_ptr
            ((shared_ptr<mwheel::test::PluginExtension> *)0x11396e);
  return (int)this;
}

Assistant:

ClientInterface::clone_type PluginExtension::clone() { return make_shared<PluginExtension>(); }